

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O3

string * __thiscall
leveldb::VersionEdit::DebugString_abi_cxx11_(string *__return_storage_ptr__,VersionEdit *this)

{
  VersionEdit *pVVar1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  pointer ppVar4;
  ulong uVar5;
  string local_58;
  VersionEdit *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (this->has_comparator_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(this->comparator_)._M_dataplus._M_p);
  }
  if (this->has_log_number_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,this->log_number_);
  }
  if (this->has_prev_log_number_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,this->prev_log_number_);
  }
  if (this->has_next_file_number_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,this->next_file_number_);
  }
  if (this->has_last_sequence_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,this->last_sequence_);
  }
  if ((this->compact_pointers_).
      super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->compact_pointers_).
      super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 8;
    uVar5 = 0;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      AppendNumberTo(__return_storage_ptr__,
                     (long)*(int *)((long)(this->compact_pointers_).
                                          super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      InternalKey::DebugString_abi_cxx11_
                (&local_58,
                 (InternalKey *)
                 ((long)&((this->compact_pointers_).
                          super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first + lVar3));
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar5 < (ulong)(((long)(this->compact_pointers_).
                                    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->compact_pointers_).
                                    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333));
  }
  for (p_Var2 = (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,(long)(int)p_Var2[1]._M_color);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,(uint64_t)p_Var2[1]._M_parent);
  }
  ppVar4 = (this->new_files_).
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->new_files_).
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    lVar3 = 0x20;
    uVar5 = 0;
    local_38 = this;
    do {
      pVVar1 = local_38;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      AppendNumberTo(__return_storage_ptr__,
                     (long)*(int *)((long)(pVVar1->new_files_).
                                          super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x20)
                    );
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      AppendNumberTo(__return_storage_ptr__,*(uint64_t *)((long)ppVar4 + lVar3 + -0x10));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      AppendNumberTo(__return_storage_ptr__,*(uint64_t *)((long)ppVar4 + lVar3 + -8));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      InternalKey::DebugString_abi_cxx11_(&local_58,(InternalKey *)((long)&ppVar4->first + lVar3));
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      InternalKey::DebugString_abi_cxx11_
                (&local_58,
                 (InternalKey *)((long)&(ppVar4->second).smallest.rep_._M_dataplus._M_p + lVar3));
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
      ppVar4 = (local_38->new_files_).
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x60;
    } while (uVar5 < (ulong)(((long)(local_38->new_files_).
                                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 5)
                            * -0x5555555555555555));
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string VersionEdit::DebugString() const {
  std::string r;
  r.append("VersionEdit {");
  if (has_comparator_) {
    r.append("\n  Comparator: ");
    r.append(comparator_);
  }
  if (has_log_number_) {
    r.append("\n  LogNumber: ");
    AppendNumberTo(&r, log_number_);
  }
  if (has_prev_log_number_) {
    r.append("\n  PrevLogNumber: ");
    AppendNumberTo(&r, prev_log_number_);
  }
  if (has_next_file_number_) {
    r.append("\n  NextFile: ");
    AppendNumberTo(&r, next_file_number_);
  }
  if (has_last_sequence_) {
    r.append("\n  LastSeq: ");
    AppendNumberTo(&r, last_sequence_);
  }
  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    r.append("\n  CompactPointer: ");
    AppendNumberTo(&r, compact_pointers_[i].first);
    r.append(" ");
    r.append(compact_pointers_[i].second.DebugString());
  }
  for (const auto& deleted_files_kvp : deleted_files_) {
    r.append("\n  DeleteFile: ");
    AppendNumberTo(&r, deleted_files_kvp.first);
    r.append(" ");
    AppendNumberTo(&r, deleted_files_kvp.second);
  }
  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    r.append("\n  AddFile: ");
    AppendNumberTo(&r, new_files_[i].first);
    r.append(" ");
    AppendNumberTo(&r, f.number);
    r.append(" ");
    AppendNumberTo(&r, f.file_size);
    r.append(" ");
    r.append(f.smallest.DebugString());
    r.append(" .. ");
    r.append(f.largest.DebugString());
  }
  r.append("\n}\n");
  return r;
}